

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool __thiscall
testing::internal::
OnCallSpec<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>::Matches
          (OnCallSpec<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)> *this
          ,ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<3ul>::
          Matches<std::tuple<testing::Matcher<BasicTestExpr<2>>,testing::Matcher<BasicTestExpr<2>>,testing::Matcher<BasicTestExpr<2>>>,std::tuple<BasicTestExpr<2>,BasicTestExpr<2>,BasicTestExpr<2>>>
                    ((tuple<testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>,_testing::Matcher<BasicTestExpr<2>_>_>
                      *)(this + 0x10),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>_>_&>::
            Matches((MatcherBase<const_std::tuple<BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>_>_&>
                     *)(this + 0x58),args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }